

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

char * address_port(lua_State *L,char *tmp,char *addr,int port_index,int *port)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  lua_Integer lVar5;
  char *sep_1;
  char *sep;
  char *host;
  int *port_local;
  int port_index_local;
  char *addr_local;
  char *tmp_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,port_index);
  if (iVar1 < 1) {
    pcVar2 = strchr(addr,0x5b);
    sep = tmp;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strchr(addr,0x3a);
      if (pcVar2 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      memcpy(tmp,addr,(long)pcVar2 - (long)addr);
      tmp[(long)pcVar2 - (long)addr] = '\0';
      uVar4 = strtoul(pcVar2 + 1,(char **)0x0,10);
      *port = (int)uVar4;
    }
    else {
      pcVar2 = pcVar2 + 1;
      pcVar3 = strchr(addr,0x5d);
      if (pcVar3 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      memcpy(tmp,pcVar2,(long)pcVar3 - (long)pcVar2);
      tmp[(long)pcVar3 - (long)pcVar2] = '\0';
      pcVar2 = strchr(pcVar3 + 1,0x3a);
      if (pcVar2 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      uVar4 = strtoul(pcVar2 + 1,(char **)0x0,10);
      *port = (int)uVar4;
    }
  }
  else {
    lVar5 = luaL_optinteger(L,port_index,0);
    *port = (int)lVar5;
    sep = addr;
  }
  return sep;
}

Assistant:

static const char *
address_port(lua_State *L, char *tmp, const char * addr, int port_index, int *port) {
	const char * host;
	if (lua_isnoneornil(L,port_index)) {
		host = strchr(addr, '[');
		if (host) {
			// is ipv6
			++host;
			const char * sep = strchr(addr,']');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			memcpy(tmp, host, sep-host);
			tmp[sep-host] = '\0';
			host = tmp;
			sep = strchr(sep + 1, ':');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			*port = strtoul(sep+1,NULL,10);
		} else {
			// is ipv4
			const char * sep = strchr(addr,':');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			memcpy(tmp, addr, sep-addr);
			tmp[sep-addr] = '\0';
			host = tmp;
			*port = strtoul(sep+1,NULL,10);
		}
	} else {
		host = addr;
		*port = luaL_optinteger(L,port_index, 0);
	}
	return host;
}